

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)

{
  ulong uVar1;
  sxu16 *psVar2;
  lhash_kv_engine *pEngine;
  int iVar3;
  uint uVar4;
  lhpage *plVar5;
  int iVar6;
  lhpage *plVar7;
  uint uVar8;
  bool bVar9;
  sxu16 iOfft;
  unqlite_page *pRaw;
  sxu16 local_5e;
  uint local_5c;
  sxu64 local_58;
  lhpage **local_50;
  sxu16 *local_48;
  lhash_kv_engine *local_40;
  unqlite_page *local_38;
  
  local_40 = pPage->pHash;
  plVar5 = pPage->pMaster;
  local_58 = nAmount;
  local_50 = ppSlave;
  local_48 = pOfft;
  if (0 < plVar5->iSlave) {
    plVar7 = plVar5->pSlave;
    local_5c = (int)nAmount + 0x1a;
    uVar8 = local_5c & 0xffff;
    iVar6 = 0;
    do {
      iVar3 = lhAllocateSpace(plVar7,(ulong)uVar8,&local_5e);
      if (iVar3 == 0) {
        bVar9 = true;
        uVar4 = local_5c;
      }
      else {
        iVar3 = lhAllocateSpace(plVar7,0x1a,&local_5e);
        bVar9 = iVar3 == 0;
        uVar4 = 0x1a;
      }
      if (bVar9) {
        if (local_48 == (sxu16 *)0x0) {
          lhRestoreSpace(plVar7,local_5e,(sxu16)uVar4);
        }
        else {
          *local_48 = local_5e;
        }
        *local_50 = plVar7;
      }
      else {
        plVar7 = plVar7->pNextSlave;
      }
      if (bVar9) {
        return 0;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < plVar5->iSlave);
  }
  pEngine = local_40;
  iVar6 = lhAcquirePage(local_40,&local_38);
  if (iVar6 == 0) {
    plVar7 = plVar5->pSlave;
    if (plVar5->pSlave == (lhpage *)0x0) {
      plVar7 = plVar5;
    }
    plVar5 = lhNewPage(pEngine,local_38,plVar5);
    if (plVar5 == (lhpage *)0x0) {
      iVar6 = -1;
    }
    else {
      iVar6 = lhSetEmptyPage(plVar5);
      psVar2 = local_48;
      if (iVar6 == 0) {
        if (local_48 != (sxu16 *)0x0) {
          iVar6 = lhAllocateSpace(plVar5,local_58 + 0x1a,&local_5e);
          if (iVar6 != 0) {
            lhAllocateSpace(plVar5,0x1a,&local_5e);
          }
          *psVar2 = local_5e;
        }
        iVar6 = (*pEngine->pIo->xWrite)(plVar7->pRaw);
        if (iVar6 == 0) {
          uVar1 = local_38->iPage;
          *(ulong *)(plVar7->pRaw->zData + 4) =
               uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
          (plVar7->sHdr).iSlave = local_38->iPage;
          *local_50 = plVar5;
          return 0;
        }
      }
      (*pEngine->pIo->xPageUnref)(plVar5->pRaw);
    }
  }
  return iVar6;
}

Assistant:

static int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)
{
	lhash_kv_engine *pEngine = pPage->pHash;
	lhpage *pMaster = pPage->pMaster;
	lhpage *pSlave = pMaster->pSlave;
	unqlite_page *pRaw;
	lhpage *pNew;
	sxu16 iOfft;
	sxi32 i;
	int rc;
	/* Look for an already attached slave page */
	for( i = 0 ; i < pMaster->iSlave ; ++i ){
		/* Find a free chunk big enough */
		sxu16 size = (sxu16)(L_HASH_CELL_SZ + nAmount);
		rc = lhAllocateSpace(pSlave,size,&iOfft);
		if( rc != UNQLITE_OK ){
			/* A space for cell header only */
			size = L_HASH_CELL_SZ;
			rc = lhAllocateSpace(pSlave,size,&iOfft);
		}
		if( rc == UNQLITE_OK ){
			/* All done */
			if( pOfft ){
				*pOfft = iOfft;
			}else{
				rc = lhRestoreSpace(pSlave, iOfft, size);
			}
			*ppSlave = pSlave;
			return rc;
		}
		/* Point to the next slave page */
		pSlave = pSlave->pNextSlave;
	}
	/* Acquire a new slave page */
	rc = lhAcquirePage(pEngine,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Last slave page */
	pSlave = pMaster->pSlave;
	if( pSlave == 0 ){
		/* First slave page */
		pSlave = pMaster;
	}
	/* Initialize the page */
	pNew = lhNewPage(pEngine,pRaw,pMaster);
	if( pNew == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Mark as an empty page */
	rc = lhSetEmptyPage(pNew);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	if( pOfft ){
		/* Look for a free block */
		if( UNQLITE_OK != lhAllocateSpace(pNew,L_HASH_CELL_SZ+nAmount,&iOfft) ){
			/* Cell header only */
			lhAllocateSpace(pNew,L_HASH_CELL_SZ,&iOfft); /* Never fail */
		}	
		*pOfft = iOfft;
	}
	/* Link this page to the previous slave page */
	rc = pEngine->pIo->xWrite(pSlave->pRaw);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Reflect in the page header */
	SyBigEndianPack64(&pSlave->pRaw->zData[2/*Cell offset*/+2/*Free block offset*/],pRaw->iPage);
	pSlave->sHdr.iSlave = pRaw->iPage;
	/* All done */
	*ppSlave = pNew;
	return UNQLITE_OK;
fail:
	pEngine->pIo->xPageUnref(pNew->pRaw); /* pNew will be released in this call */
	return rc;

}